

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<char,short>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> bits;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_00;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_01;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_02;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_01;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_02;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_03;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_04;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_05;
  short u2;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  char t;
  short u;
  undefined6 in_stack_ffffffffffffff28;
  short in_stack_ffffffffffffff2e;
  undefined4 in_stack_ffffffffffffff30;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffff34;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffff36;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffff37;
  undefined1 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff39;
  undefined1 in_stack_ffffffffffffff3a;
  undefined1 in_stack_ffffffffffffff3b;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  undefined2 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff42;
  undefined1 in_stack_ffffffffffffff43;
  undefined1 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8 [2];
  byte local_4;
  char local_3;
  short local_2;
  
  local_2 = 0;
  local_3 = 0;
  local_4 = 0;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,(short *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(local_8,&local_2);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))));
  local_4 = (local_4 ^ 0xff) & 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (char *)CONCAT17(in_stack_ffffffffffffff3f,
                              CONCAT16(in_stack_ffffffffffffff3e,
                                       CONCAT24(in_stack_ffffffffffffff3c,
                                                CONCAT13(in_stack_ffffffffffffff3b,
                                                         CONCAT12(in_stack_ffffffffffffff3a,
                                                                  CONCAT11(in_stack_ffffffffffffff39
                                                                           ,
                                                  in_stack_ffffffffffffff38)))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (short *)CONCAT17(in_stack_ffffffffffffff3f,
                               CONCAT16(in_stack_ffffffffffffff3e,
                                        CONCAT24(in_stack_ffffffffffffff3c,
                                                 CONCAT13(in_stack_ffffffffffffff3b,
                                                          CONCAT12(in_stack_ffffffffffffff3a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff39,
                                                  in_stack_ffffffffffffff38)))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
              CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
  SafeInt::operator_cast_to_short
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
            );
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  operator*(0,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,in_stack_ffffffffffffff2e);
  rhs.m_int._1_1_ = in_stack_ffffffffffffff37.m_int;
  rhs.m_int._0_1_ = in_stack_ffffffffffffff36.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),rhs);
  local_2 = 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,in_stack_ffffffffffffff2e);
  rhs_00.m_int._1_1_ = in_stack_ffffffffffffff47;
  rhs_00.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             rhs_00);
  local_2 = 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  operator/(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff36);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,in_stack_ffffffffffffff2e);
  i.m_int._1_1_ = in_stack_ffffffffffffff47;
  i.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),i
            );
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  operator+(0,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,in_stack_ffffffffffffff2e);
  rhs_01.m_int._1_1_ = in_stack_ffffffffffffff47;
  rhs_01.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             rhs_01);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  local_2 = 0;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             in_stack_ffffffffffffff46);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  operator-(0,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,in_stack_ffffffffffffff2e);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  rhs_02.m_int._1_1_ = in_stack_ffffffffffffff47;
  rhs_02.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             rhs_02);
  local_2 = 1;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46.m_int,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   in_stack_ffffffffffffff40)))))),
             (int *)CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,
                                               CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 CONCAT11(in_stack_ffffffffffffff39,
                                                                          in_stack_ffffffffffffff38)
                                                                ))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             CONCAT11(in_stack_ffffffffffffff37.m_int,in_stack_ffffffffffffff36.m_int));
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  bits_01.m_int._1_1_ = in_stack_ffffffffffffff45;
  bits_01.m_int._0_1_ = in_stack_ffffffffffffff44;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             bits_01);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  operator<<((char)((uint)in_stack_ffffffffffffff30 >> 0x18),in_stack_ffffffffffffff34);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,in_stack_ffffffffffffff2e);
  bits.m_int._1_1_ = in_stack_ffffffffffffff37.m_int;
  bits.m_int._0_1_ = in_stack_ffffffffffffff36.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),bits);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             CONCAT11(in_stack_ffffffffffffff37.m_int,in_stack_ffffffffffffff36.m_int));
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  bits_02.m_int._1_1_ = in_stack_ffffffffffffff45;
  bits_02.m_int._0_1_ = in_stack_ffffffffffffff44;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             bits_02);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  operator>>((char)((uint)in_stack_ffffffffffffff30 >> 0x18),in_stack_ffffffffffffff34);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,in_stack_ffffffffffffff2e);
  bits_00.m_int._1_1_ = in_stack_ffffffffffffff37.m_int;
  bits_00.m_int._0_1_ = in_stack_ffffffffffffff36.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),bits_00);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),in_stack_ffffffffffffff36
            );
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  operator&('\0',(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),in_stack_ffffffffffffff37
            );
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,in_stack_ffffffffffffff2e);
  rhs_03.m_int._1_1_ = in_stack_ffffffffffffff47;
  rhs_03.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             rhs_03);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),in_stack_ffffffffffffff36
            );
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  operator|('\0',(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),in_stack_ffffffffffffff37
            );
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,in_stack_ffffffffffffff2e);
  rhs_04.m_int._1_1_ = in_stack_ffffffffffffff47;
  rhs_04.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             rhs_04);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),in_stack_ffffffffffffff36
            );
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  operator^('\0',(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = SafeInt::operator_cast_to_char
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff37.m_int,
                                CONCAT16(in_stack_ffffffffffffff36.m_int,
                                         CONCAT24(in_stack_ffffffffffffff34.m_int,
                                                  in_stack_ffffffffffffff30))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),in_stack_ffffffffffffff37
            );
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff37.m_int,
                      CONCAT16(in_stack_ffffffffffffff36.m_int,
                               CONCAT24(in_stack_ffffffffffffff34.m_int,in_stack_ffffffffffffff30)))
             ,in_stack_ffffffffffffff2e);
  rhs_05.m_int._1_1_ = in_stack_ffffffffffffff47;
  rhs_05.m_int._0_1_ = in_stack_ffffffffffffff46.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))))),
             rhs_05);
  local_4 = operator<((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                      (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator<((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,0);
  local_4 = operator<(0,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator<((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                      (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator<=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator<=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,0);
  local_4 = operator<=(0,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator<=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator>((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                      (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator>((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,0);
  local_4 = operator>(0,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator>((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                      (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator>=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator>=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,0);
  local_4 = operator>=(0,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator>=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator==((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_4 = operator==((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,0);
  local_4 = operator==(0,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  operator==((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
             (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}